

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flicker_remover.cxx
# Opt level: O2

void __thiscall FlickerRemover::~FlickerRemover(FlickerRemover *this)

{
  this->_vptr_FlickerRemover = (_func_int **)&PTR__FlickerRemover_001208b8;
  clear(this);
  cv::UMat::~UMat(&this->flicker_counter);
  cv::UMat::~UMat(&this->adjacent_frames_similarity_sum);
  cv::UMat::~UMat(&this->corresponding_frames_similarity_sum);
  CircularBuffer<cv::UMat_*>::~CircularBuffer(&this->adjacent_frames_similarity_levels);
  CircularBuffer<cv::UMat_*>::~CircularBuffer(&this->corresponding_frames_similarity_levels);
  CircularBuffer<cv::UMat_*>::~CircularBuffer(&this->frames_block);
  std::vector<cv::UMat,_std::allocator<cv::UMat>_>::~vector(&this->masks);
  return;
}

Assistant:

FlickerRemover::~FlickerRemover()
{
    clear();
}